

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Statement.cpp
# Opt level: O0

ER __thiscall slang::ast::Statement::eval(Statement *this,EvalContext *context)

{
  ER EVar1;
  EvalContext *in_RDI;
  EvalVisitor visitor;
  EvalVisitor *unaff_retaddr;
  
  EVar1 = visit<(anonymous_namespace)::EvalVisitor&,slang::ast::EvalContext&>
                    ((Statement *)context,unaff_retaddr,in_RDI);
  return EVar1;
}

Assistant:

ER Statement::eval(EvalContext& context) const {
    EvalVisitor visitor;
    return visit(visitor, context);
}